

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O0

Var Js::JavascriptMath::Divide_InPlace
              (Var aLeft,Var aRight,ScriptContext *scriptContext,JavascriptNumber *result)

{
  bool bVar1;
  double value;
  double quotient;
  JavascriptNumber *result_local;
  ScriptContext *scriptContext_local;
  Var aRight_local;
  Var aLeft_local;
  
  bVar1 = TaggedInt::IsPair(aLeft,aRight);
  if (bVar1) {
    aLeft_local = TaggedInt::DivideInPlace(aLeft,aRight,scriptContext,result);
  }
  else {
    value = Divide_Helper(aLeft,aRight,scriptContext);
    aLeft_local = JavascriptNumber::InPlaceNew(value,scriptContext,result);
  }
  return aLeft_local;
}

Assistant:

Var JavascriptMath::Divide_InPlace(Var aLeft, Var aRight, ScriptContext* scriptContext, JavascriptNumber* result)
        {
            JIT_HELPER_REENTRANT_HEADER(Op_DivideInPlace);
            // If both arguments are TaggedInt, then try to do integer division
            // This case is not handled by the lowerer.
            if (TaggedInt::IsPair(aLeft, aRight))
            {
                return TaggedInt::DivideInPlace(aLeft, aRight, scriptContext, result);
            }

            double quotient = Divide_Helper(aLeft, aRight, scriptContext);
            return JavascriptNumber::InPlaceNew(quotient, scriptContext, result);
            JIT_HELPER_END(Op_DivideInPlace);
        }